

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall Imath_2_5::Matrix44<float>::invert(Matrix44<float> *this,bool singExc)

{
  byte in_SIL;
  Matrix44<float> *in_RDI;
  bool in_stack_000000d7;
  Matrix44<float> *in_stack_000000d8;
  Matrix44<float> local_4c;
  byte local_9;
  
  local_9 = in_SIL & 1;
  inverse(in_stack_000000d8,in_stack_000000d7);
  operator=(in_RDI,&local_4c);
  return in_RDI;
}

Assistant:

const Matrix44<T> &
Matrix44<T>::invert (bool singExc)
{
    *this = inverse (singExc);
    return *this;
}